

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionDefinitionHandler.cpp
# Opt level: O0

bool __thiscall Shell::InductionTemplate::checkUsefulness(InductionTemplate *this)

{
  bool bVar1;
  const_reference *p;
  const_iterator __end1;
  const_iterator __begin1;
  vector<bool,_std::allocator<bool>_> *__range1;
  bool discard;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  _Bit_iterator_base *in_stack_ffffffffffffffa0;
  byte local_9;
  
  local_9 = 1;
  std::vector<bool,_std::allocator<bool>_>::begin((vector<bool,_std::allocator<bool>_> *)0xba1f96);
  std::vector<bool,_std::allocator<bool>_>::end((vector<bool,_std::allocator<bool>_> *)0xba1fbb);
  while( true ) {
    bVar1 = std::operator!=(in_stack_ffffffffffffffa0,
                            (_Bit_iterator_base *)
                            CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98));
    if (!bVar1) break;
    in_stack_ffffffffffffff9f =
         std::_Bit_const_iterator::operator*((_Bit_const_iterator *)in_stack_ffffffffffffffa0);
    in_stack_ffffffffffffffa0 = (_Bit_iterator_base *)&stack0xffffffffffffff9f;
    if ((bool)in_stack_ffffffffffffff9f) {
      local_9 = 0;
    }
    std::_Bit_const_iterator::operator++((_Bit_const_iterator *)in_stack_ffffffffffffffa0);
  }
  return (bool)((local_9 ^ 0xff) & 1);
}

Assistant:

bool InductionTemplate::checkUsefulness() const
{
  // discard templates without inductive argument positions:
  // this happens either when there are no recursive calls
  // or none of the arguments change in any recursive call
  bool discard = true;
  for (const auto& p : _indPos) {
    if (p) {
      discard = false;
    }
  }
  return !discard;
}